

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urandom_test.cc
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  int local_4;
  
  testing::InitGoogleTest(&local_4,argv);
  pcVar2 = getenv("BORINGSSL_IGNORE_MADV_WIPEONFORK");
  CRYPTO_fork_detect_force_madv_wipeonfork_for_testing((uint)(pcVar2 == (char *)0x0));
  iVar1 = RUN_ALL_TESTS();
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
  ::testing::InitGoogleTest(&argc, argv);

  if (getenv("BORINGSSL_IGNORE_MADV_WIPEONFORK")) {
    CRYPTO_fork_detect_force_madv_wipeonfork_for_testing(0);
  } else {
    CRYPTO_fork_detect_force_madv_wipeonfork_for_testing(1);
  }

  return RUN_ALL_TESTS();
}